

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NavRestoreLayer(ImGuiNavLayer layer)

{
  ImGuiID IVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar3 = GImGui;
  window = GImGui->NavWindow;
  if (layer == ImGuiNavLayer_Main) {
    pIVar2 = window->NavLastChildNavWindow;
    if ((pIVar2 == (ImGuiWindow *)0x0) || (pIVar2->WasActive == false)) {
      pIVar2 = window;
    }
    window = pIVar2;
    GImGui->NavWindow = window;
  }
  IVar1 = window->NavLastIds[layer];
  if (IVar1 != 0) {
    pIVar3->NavId = IVar1;
    pIVar3->NavLayer = layer;
    pIVar3->NavFocusScopeId = 0;
    window->NavLastIds[layer] = IVar1;
    return;
  }
  pIVar3->NavLayer = layer;
  NavInitWindow(window,true);
  return;
}

Assistant:

void ImGui::NavRestoreLayer(ImGuiNavLayer layer)
{
    ImGuiContext& g = *GImGui;
    if (layer == ImGuiNavLayer_Main)
        g.NavWindow = NavRestoreLastChildNavWindow(g.NavWindow);
    ImGuiWindow* window = g.NavWindow;
    if (window->NavLastIds[layer] != 0)
    {
        SetNavID(window->NavLastIds[layer], layer, 0, window->NavRectRel[layer]);
    }
    else
    {
        g.NavLayer = layer;
        NavInitWindow(window, true);
    }
}